

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

bool __thiscall FSerializer::OpenReader(FSerializer *this,FCompressedBuffer *input)

{
  FReader *pFVar1;
  char *destbuffer;
  char *unpacked;
  FCompressedBuffer *input_local;
  FSerializer *this_local;
  
  if ((input->mSize == 0) || (input->mBuffer == (char *)0x0)) {
    this_local._7_1_ = false;
  }
  else if ((this->w == (FWriter *)0x0) && (this->r == (FReader *)0x0)) {
    this->mErrors = 0;
    if (input->mMethod == 0) {
      pFVar1 = (FReader *)operator_new(0xb8);
      FReader::FReader(pFVar1,input->mBuffer,(ulong)input->mSize);
      this->r = pFVar1;
    }
    else {
      destbuffer = (char *)operator_new__((ulong)input->mSize);
      FCompressedBuffer::Decompress(input,destbuffer);
      pFVar1 = (FReader *)operator_new(0xb8);
      FReader::FReader(pFVar1,destbuffer,(ulong)input->mSize);
      this->r = pFVar1;
      if (destbuffer != (char *)0x0) {
        operator_delete__(destbuffer);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FSerializer::OpenReader(FCompressedBuffer *input)
{
	if (input->mSize <= 0 || input->mBuffer == nullptr) return false;
	if (w != nullptr || r != nullptr) return false;

	mErrors = 0;
	if (input->mMethod == METHOD_STORED)
	{
		r = new FReader((char*)input->mBuffer, input->mSize);
	}
	else
	{
		char *unpacked = new char[input->mSize];
		input->Decompress(unpacked);
		r = new FReader(unpacked, input->mSize);
		delete[] unpacked;
	}
	return true;
}